

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFileContainingSymbol(DescriptorPool *this,string *symbol_name)

{
  Type TVar1;
  Tables *pTVar2;
  _Node **pp_Var3;
  ulong uVar4;
  char *pcVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  FileDescriptor *pFVar9;
  char cVar10;
  char *pcVar11;
  _Node *p_Var12;
  _Node *p_Var13;
  Symbol *pSVar14;
  MutexLockMaybe lock;
  MutexLockMaybe local_38;
  
  local_38.mu_ = this->mutex_;
  if (local_38.mu_ != (Mutex *)0x0) {
    internal::Mutex::Lock(local_38.mu_);
  }
  pTVar2 = (this->tables_).ptr_;
  if (pTVar2 == (Tables *)0x0) {
LAB_001caa65:
    __assert_fail("ptr_ != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                  ,0x1e2,
                  "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
                 );
  }
  pp_Var3 = (pTVar2->symbols_by_name_).
            super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
            .
            super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
            .
            super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
            ._M_buckets;
  uVar4 = (pTVar2->symbols_by_name_).
          super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
          .
          super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
          .
          super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
          ._M_bucket_count;
  pcVar5 = (symbol_name->_M_dataplus)._M_p;
  cVar10 = *pcVar5;
  if (cVar10 == '\0') {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    pcVar11 = pcVar5;
    do {
      pcVar11 = pcVar11 + 1;
      uVar8 = (long)cVar10 + uVar8 * 5;
      cVar10 = *pcVar11;
    } while (cVar10 != '\0');
  }
  for (p_Var13 = pp_Var3[uVar8 % uVar4]; p_Var13 != (_Node *)0x0; p_Var13 = p_Var13->_M_next) {
    iVar7 = strcmp(pcVar5,(p_Var13->_M_v).first);
    if (iVar7 == 0) {
      p_Var12 = pp_Var3[uVar4];
      goto LAB_001ca94a;
    }
  }
  p_Var12 = pp_Var3[uVar4];
  p_Var13 = p_Var12;
LAB_001ca94a:
  pSVar14 = &(p_Var13->_M_v).second;
  if (p_Var13 == p_Var12) {
    pSVar14 = (Symbol *)&(anonymous_namespace)::kNullSymbol;
  }
  TVar1 = pSVar14->type;
  if (TVar1 == NULL_SYMBOL) {
    if ((this->underlay_ != (DescriptorPool *)0x0) &&
       (pFVar9 = FindFileContainingSymbol(this->underlay_,symbol_name),
       pFVar9 != (FileDescriptor *)0x0)) goto LAB_001ca983;
    bVar6 = TryFindSymbolInFallbackDatabase(this,symbol_name);
    if (bVar6) {
      pTVar2 = (this->tables_).ptr_;
      if (pTVar2 == (Tables *)0x0) goto LAB_001caa65;
      pp_Var3 = (pTVar2->symbols_by_name_).
                super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                .
                super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                .
                super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ._M_buckets;
      uVar4 = (pTVar2->symbols_by_name_).
              super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
              .
              super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
              .
              super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_bucket_count;
      pcVar5 = (symbol_name->_M_dataplus)._M_p;
      cVar10 = *pcVar5;
      if (cVar10 == '\0') {
        uVar8 = 0;
      }
      else {
        uVar8 = 0;
        pcVar11 = pcVar5;
        do {
          pcVar11 = pcVar11 + 1;
          uVar8 = (long)cVar10 + uVar8 * 5;
          cVar10 = *pcVar11;
        } while (cVar10 != '\0');
      }
      for (p_Var13 = pp_Var3[uVar8 % uVar4]; p_Var13 != (_Node *)0x0; p_Var13 = p_Var13->_M_next) {
        iVar7 = strcmp(pcVar5,(p_Var13->_M_v).first);
        if (iVar7 == 0) {
          p_Var12 = pp_Var3[uVar4];
          goto LAB_001caa3c;
        }
      }
      p_Var12 = pp_Var3[uVar4];
      p_Var13 = p_Var12;
LAB_001caa3c:
      pSVar14 = &(p_Var13->_M_v).second;
      if (p_Var13 == p_Var12) {
        pSVar14 = (Symbol *)&(anonymous_namespace)::kNullSymbol;
      }
      TVar1 = pSVar14->type;
      if (TVar1 != NULL_SYMBOL) goto LAB_001ca96d;
    }
    pFVar9 = (FileDescriptor *)0x0;
  }
  else {
LAB_001ca96d:
    pFVar9 = anon_unknown_1::Symbol::GetFile((Symbol *)(ulong)TVar1);
  }
LAB_001ca983:
  internal::MutexLockMaybe::~MutexLockMaybe(&local_38);
  return pFVar9;
}

Assistant:

const FileDescriptor* DescriptorPool::FindFileContainingSymbol(
    const string& symbol_name) const {
  MutexLockMaybe lock(mutex_);
  Symbol result = tables_->FindSymbol(symbol_name);
  if (!result.IsNull()) return result.GetFile();
  if (underlay_ != NULL) {
    const FileDescriptor* file_result =
      underlay_->FindFileContainingSymbol(symbol_name);
    if (file_result != NULL) return file_result;
  }
  if (TryFindSymbolInFallbackDatabase(symbol_name)) {
    result = tables_->FindSymbol(symbol_name);
    if (!result.IsNull()) return result.GetFile();
  }
  return NULL;
}